

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall
duckdb::HashJoinLocalSourceState::ExecuteTask
          (HashJoinLocalSourceState *this,HashJoinGlobalSinkState *sink,
          HashJoinGlobalSourceState *gstate,DataChunk *chunk)

{
  HashJoinSourceStage HVar1;
  InternalException *this_00;
  string local_40;
  
  HVar1 = this->local_stage;
  if (HVar1 == SCAN_HT) {
    ExternalScanHT(this,sink,gstate,chunk);
    return;
  }
  if (HVar1 != PROBE) {
    if (HVar1 == BUILD) {
      ExternalBuild(this,sink,gstate);
      return;
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unexpected HashJoinSourceStage in ExecuteTask!","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ExternalProbe(this,sink,gstate,chunk);
  return;
}

Assistant:

void HashJoinLocalSourceState::ExecuteTask(HashJoinGlobalSinkState &sink, HashJoinGlobalSourceState &gstate,
                                           DataChunk &chunk) {
	switch (local_stage) {
	case HashJoinSourceStage::BUILD:
		ExternalBuild(sink, gstate);
		break;
	case HashJoinSourceStage::PROBE:
		ExternalProbe(sink, gstate, chunk);
		break;
	case HashJoinSourceStage::SCAN_HT:
		ExternalScanHT(sink, gstate, chunk);
		break;
	default:
		throw InternalException("Unexpected HashJoinSourceStage in ExecuteTask!");
	}
}